

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_fraction.h
# Opt level: O2

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_int,9u>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               fraction_t<unsigned_int,_9U> *fmt)

{
  value_type_conflict3 vVar1;
  long lVar2;
  long lVar3;
  
  vVar1 = 0;
  lVar3 = 9;
  lVar2 = 0;
  do {
    if (lVar2 == 9) {
LAB_0010b41b:
      for (lVar3 = lVar3 + -9; lVar3 != 0; lVar3 = lVar3 + 1) {
        vVar1 = vVar1 * 10;
      }
      *fmt->value = vVar1;
      return true;
    }
    if ((end->m_position == pos->m_position) ||
       ((byte)(pos->m_cache[pos->m_position] - 0x3aU) < 0xf6)) {
      lVar3 = lVar2;
      if (lVar2 == 0) {
        return false;
      }
      goto LAB_0010b41b;
    }
    vVar1 = (vVar1 * 10 + (uint)(byte)pos->m_cache[pos->m_position]) - 0x30;
    lVar2 = lVar2 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  } while( true );
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, fraction_t<UnsignedInt, Width>& fmt, Others&&... others)
{
    using char_type  = typename iterator_traits<Iterator>::value_type;

    auto x = UnsignedInt{ 0 };
    auto count = std::size_t{ 0 };
    while (count < Width)
    {
        if (pos == end)
            break;

        const char_type ch = *pos;
        if ((ch < char_type{ '0' }) || (ch > char_type{ '9' }))
            break;

        x = 10 * x + static_cast<UnsignedInt>(ch - char_type{ '0' });
        ++count;
        ++pos; 
    }

    if (count == 0)
        return false;

    while (count < Width)
    {
        x = 10 * x;
        ++count;
    }
    
    fmt.value = x;
    return read_impl(pos, end, std::forward<Others>(others)...);
}